

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Magazine.cpp
# Opt level: O0

void __thiscall Magazine::printProperties(Magazine *this)

{
  ostream *poVar1;
  Magazine *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Magazine Type: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->type);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Magazine Issue: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Issue);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Magazine::printProperties() {
	cout << "Magazine Type: " << type << endl;
	cout << "Magazine Issue: " << Issue << endl;
}